

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

bool __thiscall
QWidgetPrivate::removeFromFocusChain
          (QWidgetPrivate *this,FocusChainRemovalRules rules,FocusDirection direction)

{
  bool bVar1;
  QWidget *pQVar2;
  QWidgetPrivate *pQVar3;
  QWidgetPrivate *pQVar4;
  int in_EDX;
  QWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  QWidget *q;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_2;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_1;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  undefined4 in_stack_fffffffffffffee8;
  FocusChainRemovalRule in_stack_fffffffffffffeec;
  undefined4 in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  char *in_stack_fffffffffffffef8;
  QMessageLogger *in_stack_ffffffffffffff00;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  char *in_stack_ffffffffffffff38;
  QDebug local_b0;
  QDebug local_a8 [2];
  QWidget *in_stack_ffffffffffffff68;
  QDebug *in_stack_ffffffffffffff70;
  QDebug local_80;
  QDebug local_78 [5];
  QDebug local_50;
  QDebug local_48 [2];
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = q_func(in_RDI);
  bVar1 = isFocusChainConsistent
                    ((QWidgetPrivate *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28)
                    );
  if (bVar1) {
    bVar1 = isInFocusChain((QWidgetPrivate *)
                           CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    if (bVar1) {
      bVar1 = QFlags<QWidgetPrivate::FocusChainRemovalRule>::testFlag
                        ((QFlags<QWidgetPrivate::FocusChainRemovalRule> *)
                         CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                         in_stack_fffffffffffffeec);
      if (bVar1) {
        (**(code **)(*(long *)pQVar2 + 0x198))(pQVar2,in_EDX == 1);
      }
      pQVar3 = QWidget::d_func((QWidget *)0x3622b5);
      pQVar2 = pQVar3->focus_next;
      QWidget::d_func((QWidget *)0x3622cb);
      pQVar3 = QWidget::d_func((QWidget *)0x3622d7);
      pQVar3->focus_next = pQVar2;
      pQVar3 = QWidget::d_func((QWidget *)0x3622ed);
      pQVar3 = (QWidgetPrivate *)pQVar3->focus_prev;
      QWidget::d_func((QWidget *)0x362303);
      pQVar4 = QWidget::d_func((QWidget *)0x36230f);
      pQVar4->focus_prev = (QWidget *)pQVar3;
      initFocusChain(pQVar3);
      local_38 = &DAT_aaaaaaaaaaaaaaaa;
      local_30 = &DAT_aaaaaaaaaaaaaaaa;
      lcWidgetFocus();
      anon_unknown.dwarf_2490c2::QLoggingCategoryMacroHolder<(QtMsgType)0>::
      QLoggingCategoryMacroHolder
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
                 CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                 (QLoggingCategory *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                               ((QLoggingCategoryMacroHolder *)&local_38), bVar1) {
        anon_unknown.dwarf_2490c2::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x362378);
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)pQVar3,(char *)pQVar2,in_stack_fffffffffffffef4,
                   (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                   (char *)0x36238e);
        QMessageLogger::debug();
        ::operator<<(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
        QDebug::operator<<((QDebug *)in_RDI,in_stack_ffffffffffffff38);
        QDebug::~QDebug(local_a8);
        QDebug::~QDebug(&local_b0);
        local_30 = (undefined1 *)((ulong)local_30 & 0xffffffffffffff00);
      }
      bVar1 = true;
    }
    else {
      local_28 = &DAT_aaaaaaaaaaaaaaaa;
      local_20 = &DAT_aaaaaaaaaaaaaaaa;
      lcWidgetFocus();
      anon_unknown.dwarf_2490c2::QLoggingCategoryMacroHolder<(QtMsgType)0>::
      QLoggingCategoryMacroHolder
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
                 CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                 (QLoggingCategory *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                               ((QLoggingCategoryMacroHolder *)&local_28), bVar1) {
        anon_unknown.dwarf_2490c2::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x3621ed);
        QMessageLogger::QMessageLogger
                  (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef4,
                   (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                   (char *)0x362203);
        QMessageLogger::debug();
        ::operator<<(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
        QDebug::operator<<((QDebug *)in_RDI,in_stack_ffffffffffffff38);
        QDebug::~QDebug(local_78);
        QDebug::~QDebug(&local_80);
        local_20 = (undefined1 *)((ulong)local_20 & 0xffffffffffffff00);
      }
      bVar1 = false;
    }
  }
  else {
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    lcWidgetFocus();
    anon_unknown.dwarf_2490c2::QLoggingCategoryMacroHolder<(QtMsgType)0>::
    QLoggingCategoryMacroHolder
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
               CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
               (QLoggingCategory *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_18), bVar1) {
      anon_unknown.dwarf_2490c2::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x3620f8);
      QMessageLogger::QMessageLogger
                (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef4,
                 (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                 (char *)0x362111);
      QMessageLogger::debug();
      ::operator<<(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      QDebug::operator<<((QDebug *)in_RDI,in_stack_ffffffffffffff38);
      QDebug::~QDebug(local_48);
      QDebug::~QDebug(&local_50);
      local_10 = (undefined1 *)((ulong)local_10 & 0xffffffffffffff00);
    }
    bVar1 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return bVar1;
}

Assistant:

bool QWidgetPrivate::removeFromFocusChain(FocusChainRemovalRules rules, FocusDirection direction)
{
    Q_Q(QWidget);
    if (!isFocusChainConsistent()) {
#ifdef QT_DEBUG
        if (rules.testFlag(FocusChainRemovalRule::AssertConsistency))
            qFatal() << q << "has inconsistent focus chain.";
#endif
        qCDebug(lcWidgetFocus) << q << "wasn't removed, because of inconsistent focus chain.";
        return false;
    }

    if (!isInFocusChain()) {
        qCDebug(lcWidgetFocus) << q << "wasn't removed, because it is not part of a focus chain.";
        return false;
    }

    if (rules.testFlag(FocusChainRemovalRule::EnsureFocusOut))
        q->focusNextPrevChild(direction == FocusDirection::Next);

    FOCUS_NEXT(FOCUS_PREV(q)) = FOCUS_NEXT(q);
    FOCUS_PREV(FOCUS_NEXT(q)) = FOCUS_PREV(q);
    initFocusChain();
    qCDebug(lcWidgetFocus) << q << "removed from focus chain.";
    return true;
}